

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O0

bool parseICrashStrategy(string *strategy,ICrashStrategy *icrash_strategy)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 *in_RSI;
  string *in_RDI;
  string lower;
  undefined4 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  string *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined4 *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::__cxx11::string::string((string *)&local_38,in_RDI);
  trim(in_stack_ffffffffffffff70,
       (string *)
       CONCAT17(in_stack_ffffffffffffff6f,
                CONCAT16(in_stack_ffffffffffffff6e,
                         CONCAT15(in_stack_ffffffffffffff6d,
                                  CONCAT14(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)))));
  __lhs = &local_38;
  uVar5 = std::__cxx11::string::begin();
  uVar6 = std::__cxx11::string::end();
  uVar7 = std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,parseICrashStrategy(std::__cxx11::string_const&,ICrashStrategy&)::__0>
            (uVar5,uVar6,uVar7);
  uVar1 = std::operator==(__lhs,(char *)CONCAT17(in_stack_ffffffffffffff6f,
                                                 CONCAT16(in_stack_ffffffffffffff6e,
                                                          CONCAT15(in_stack_ffffffffffffff6d,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68)))));
  if ((bool)uVar1) {
    *local_18 = 0;
  }
  else {
    uVar2 = std::operator==(__lhs,(char *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff6e,
                                                                  CONCAT15(in_stack_ffffffffffffff6d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68)))));
    if ((bool)uVar2) {
      *local_18 = 1;
    }
    else {
      uVar3 = std::operator==(__lhs,(char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(
                                                  in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
      if ((bool)uVar3) {
        *local_18 = 2;
      }
      else {
        bVar4 = std::operator==(__lhs,(char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68)))));
        if (bVar4) {
          *local_18 = 3;
        }
        else {
          bVar4 = std::operator==(__lhs,(char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,
                                                  CONCAT14(bVar4,in_stack_ffffffffffffff68)))));
          if (!bVar4) {
            local_1 = 0;
            goto LAB_0074530a;
          }
          *local_18 = 4;
        }
      }
    }
  }
  local_1 = 1;
LAB_0074530a:
  std::__cxx11::string::~string((string *)&local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool parseICrashStrategy(const std::string& strategy,
                         ICrashStrategy& icrash_strategy) {
  std::string lower = strategy;
  trim(lower);
  std::transform(lower.begin(), lower.end(), lower.begin(),
                 [](unsigned char c) { return std::tolower(c); });

  if (lower == "penalty")
    icrash_strategy = ICrashStrategy::kPenalty;
  else if (lower == "admm")
    icrash_strategy = ICrashStrategy::kAdmm;
  else if (lower == "ica")
    icrash_strategy = ICrashStrategy::kICA;
  else if (lower == "update_penalty")
    icrash_strategy = ICrashStrategy::kUpdatePenalty;
  else if (lower == "update_admm")
    icrash_strategy = ICrashStrategy::kUpdateAdmm;
  else
    return false;
  return true;
}